

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O0

int __thiscall GF2::BFunc<8UL>::Deg(BFunc<8UL> *this)

{
  int iVar1;
  MP<8UL,_GF2::MOLex<8UL>_> poly;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  BFunc<8UL> *in_stack_ffffffffffffffd0;
  
  MP<8UL,_GF2::MOLex<8UL>_>::MP
            ((MP<8UL,_GF2::MOLex<8UL>_> *)in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf)
  ;
  BFunc<8ul>::To<GF2::MOLex<8ul>>
            (in_stack_ffffffffffffffd0,
             (MP<8UL,_GF2::MOLex<8UL>_> *)
             CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  iVar1 = MP<8UL,_GF2::MOLex<8UL>_>::Deg
                    ((MP<8UL,_GF2::MOLex<8UL>_> *)
                     CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  MP<8UL,_GF2::MOLex<8UL>_>::~MP((MP<8UL,_GF2::MOLex<8UL>_> *)0x1bcf8f);
  return iVar1;
}

Assistant:

int Deg() const
	{	
		MP<_n> poly;
		To(poly);
		return poly.Deg();
	}